

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O3

void __thiscall Fl_Browser_::bbox(Fl_Browser_ *this,int *X,int *Y,int *W,int *H)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  Fl_Boxtype t;
  
  iVar2 = this->scrollbar_size_;
  if (iVar2 == 0) {
    iVar2 = Fl::scrollbar_size();
  }
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.box_;
  bVar5 = 3;
  if (bVar1 != 0) {
    bVar5 = bVar1;
  }
  t = (Fl_Boxtype)bVar5;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar3 = Fl::box_dx(t);
  *X = iVar3 + iVar4;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar3 = Fl::box_dy((uint)bVar5);
  *Y = iVar3 + iVar4;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar3 = Fl::box_dw(t);
  *W = iVar4 - iVar3;
  iVar4 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar3 = Fl::box_dh(t);
  *H = iVar4 - iVar3;
  if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
    iVar4 = *W - iVar2;
    *W = iVar4;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) == 0
       ) goto LAB_001a70b6;
    *X = *X + iVar2;
  }
  iVar4 = *W;
LAB_001a70b6:
  if (iVar4 < 0) {
    *W = 0;
  }
  iVar4 = *H;
  if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
    iVar4 = iVar4 - iVar2;
    *H = iVar4;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) != 0
       ) {
      *Y = *Y + iVar2;
      iVar4 = *H;
    }
  }
  if (iVar4 < 0) {
    *H = 0;
  }
  return;
}

Assistant:

void Fl_Browser_::bbox(int& X, int& Y, int& W, int& H) const {
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
  X = x()+Fl::box_dx(b);
  Y = y()+Fl::box_dy(b);
  W = w()-Fl::box_dw(b);
  H = h()-Fl::box_dh(b);
  if (scrollbar.visible()) {
    W -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_LEFT) X += scrollsize;
  }
  if (W < 0) W = 0;
  if (hscrollbar.visible()) {
    H -= scrollsize;
    if (scrollbar.align() & FL_ALIGN_TOP) Y += scrollsize;
  }
  if (H < 0) H = 0;
}